

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesShaderIntrinsicsSampled.cpp
# Opt level: O3

string * __thiscall
vkt::sparse::SparseCaseOpImageSparseSampleImplicitLod::sparseImageOpString
          (string *__return_storage_ptr__,SparseCaseOpImageSparseSampleImplicitLod *this,
          string *resultVariable,string *resultType,string *image,string *coord,string *miplevel)

{
  ostream *poVar1;
  ostringstream src;
  ostringstream aoStack_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)aoStack_1a8,(resultVariable->_M_dataplus)._M_p,
                      resultVariable->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1," = OpImageSparseSampleImplicitLod ",0x22);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(resultType->_M_dataplus)._M_p,resultType->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(image->_M_dataplus)._M_p,image->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(coord->_M_dataplus)._M_p,coord->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string	SparseCaseOpImageSparseSampleImplicitLod::sparseImageOpString  (const std::string& resultVariable,
																			const std::string& resultType,
																			const std::string& image,
																			const std::string& coord,
																			const std::string& miplevel) const
{
	DE_UNREF(miplevel);

	std::ostringstream	src;

	src << resultVariable << " = OpImageSparseSampleImplicitLod " << resultType << " " << image << " " << coord << "\n";

	return src.str();
}